

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O0

void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *p,int fUseAssign)

{
  Vec_Str_t *p_00;
  Bac_Man_t *p_01;
  int iVar1;
  int iVar2;
  int i_00;
  int iVar3;
  int iVar4;
  Bac_ObjType_t BVar5;
  Bac_Ntk_t *p_02;
  char *pcVar6;
  Vec_Int_t *vBits_00;
  char *pcVar7;
  bool bVar8;
  char *local_e8;
  char *local_a0;
  char *pSymbs;
  char *pName;
  Vec_Int_t *vBits;
  int iSig;
  int Range_1;
  int k_1;
  int iTerm;
  int Type;
  int NameId;
  Bac_Ntk_t *pModel;
  int Range;
  int End;
  int Beg;
  int Value;
  int StartPos;
  int o;
  int i;
  int k;
  int iObj;
  Vec_Str_t *vStr;
  int fUseAssign_local;
  Bac_Ntk_t *p_local;
  
  p_00 = p->pDesign->vOut;
  i = 0;
  do {
    iVar1 = Bac_NtkObjNum(p);
    if (iVar1 <= i) {
      return;
    }
    iVar1 = Bac_ObjIsBox(p,i);
    if ((iVar1 != 0) && (iVar1 = Bac_ObjIsConst(p,i), iVar1 == 0)) {
      iVar1 = Bac_ObjIsGate(p,i);
      if (iVar1 == 0) {
        iVar1 = Bac_ObjIsBoxUser(p,i);
        if ((iVar1 == 0) && (fUseAssign != 0)) {
          Bac_ManWriteAssign(p,i);
        }
        else {
          Beg = Vec_StrSize(p_00);
          iVar1 = Bac_ObjIsBoxUser(p,i);
          if (iVar1 == 0) {
            vBits._0_4_ = 0;
            vBits_00 = Bac_BoxCollectRanges(p,i);
            BVar5 = Bac_ObjType(p,i);
            pcVar6 = Bac_NtkGenerateName(p,BVar5,vBits_00);
            p_01 = p->pDesign;
            BVar5 = Bac_ObjType(p,i);
            pcVar7 = Bac_ManPrimSymb(p_01,BVar5);
            Vec_StrPrintStr(p_00,"  ");
            Vec_StrPrintStr(p_00,pcVar6);
            Vec_StrPrintStr(p_00," ");
            iVar1 = Bac_ObjName(p,i);
            if (iVar1 == 0) {
              local_e8 = "";
            }
            else {
              local_e8 = Bac_ObjNameStr(p,i);
            }
            Vec_StrPrintStr(p_00,local_e8);
            Vec_StrPrintStr(p_00," (");
            Range_1 = i;
            while( true ) {
              Range_1 = Range_1 + -1;
              bVar8 = false;
              if (-1 < Range_1) {
                iVar1 = Bac_ObjIsBi(p,Range_1);
                bVar8 = iVar1 != 0;
              }
              iVar1 = i;
              if (!bVar8) break;
              iVar1 = Bac_ObjBit(p,Range_1);
              if (iVar1 == 0) {
                iVar1 = Vec_IntEntry(vBits_00,(int)vBits);
                pcVar6 = "";
                if ((int)vBits != 0) {
                  pcVar6 = ", ";
                }
                Vec_StrPrintStr(p_00,pcVar6);
                iVar4 = Vec_StrSize(p_00);
                if (Beg + 0x46 < iVar4) {
                  Beg = Vec_StrSize(p_00);
                  Vec_StrPrintStr(p_00,"\n    ");
                }
                Vec_StrPrintStr(p_00,".");
                Vec_StrPush(p_00,pcVar7[(int)vBits]);
                Vec_StrPrintStr(p_00,"(");
                Bac_ManWriteConcat(p,Range_1,iVar1);
                Vec_StrPrintStr(p_00,")");
                vBits._0_4_ = (int)vBits + 1;
              }
            }
            while( true ) {
              Range_1 = iVar1 + 1;
              iVar1 = Bac_NtkObjNum(p);
              bVar8 = false;
              if (Range_1 < iVar1) {
                iVar1 = Bac_ObjIsBo(p,Range_1);
                bVar8 = iVar1 != 0;
              }
              if (!bVar8) break;
              iVar4 = Bac_ObjBit(p,Range_1);
              iVar1 = Range_1;
              if (iVar4 == 0) {
                iVar4 = Vec_IntEntry(vBits_00,(int)vBits);
                pcVar6 = "";
                if ((int)vBits != 0) {
                  pcVar6 = ", ";
                }
                Vec_StrPrintStr(p_00,pcVar6);
                iVar2 = Vec_StrSize(p_00);
                if (Beg + 0x46 < iVar2) {
                  Beg = Vec_StrSize(p_00);
                  Vec_StrPrintStr(p_00,"\n    ");
                }
                Vec_StrPrintStr(p_00,".");
                Vec_StrPush(p_00,pcVar7[(int)vBits]);
                Vec_StrPrintStr(p_00,"(");
                Bac_ManWriteConcat(p,Range_1,iVar4);
                Vec_StrPrintStr(p_00,")");
                vBits._0_4_ = (int)vBits + 1;
              }
            }
            iVar1 = Vec_IntSize(vBits_00);
            if ((int)vBits != iVar1) {
              __assert_fail("iSig == Vec_IntSize(vBits)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x240,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
          }
          else {
            p_02 = Bac_BoxNtk(p,i);
            Vec_StrPrintStr(p_00,"  ");
            pcVar6 = Bac_NtkName(p_02);
            Vec_StrPrintStr(p_00,pcVar6);
            Vec_StrPrintStr(p_00," ");
            iVar1 = Bac_ObjName(p,i);
            if (iVar1 == 0) {
              local_a0 = "";
            }
            else {
              local_a0 = Bac_ObjNameStr(p,i);
            }
            Vec_StrPrintStr(p_00,local_a0);
            Vec_StrPrintStr(p_00," (");
            Value = 0;
            StartPos = 0;
            iVar1 = Bac_NtkInfoNum(p_02);
            if (iVar1 == 0) {
              __assert_fail("Bac_NtkInfoNum(pModel)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x1fa,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
            for (o = 0; iVar1 = Vec_IntSize(&p_02->vInfo), o + 2 < iVar1; o = o + 3) {
              iVar1 = Vec_IntEntry(&p_02->vInfo,o);
              iVar4 = Vec_IntEntry(&p_02->vInfo,o + 1);
              iVar2 = Vec_IntEntry(&p_02->vInfo,o + 2);
              i_00 = Abc_Lit2Var2(iVar1);
              iVar1 = Abc_Lit2Att2(iVar1);
              pcVar6 = "";
              if (o != 0) {
                pcVar6 = ", ";
              }
              Vec_StrPrintStr(p_00,pcVar6);
              iVar3 = Vec_StrSize(p_00);
              if (Beg + 0x46 < iVar3) {
                Beg = Vec_StrSize(p_00);
                Vec_StrPrintStr(p_00,"\n    ");
              }
              Vec_StrPrintStr(p_00,".");
              pcVar6 = Bac_NtkStr(p,i_00);
              Vec_StrPrintStr(p_00,pcVar6);
              Vec_StrPrintStr(p_00,"(");
              iVar4 = Bac_InfoRange(iVar4,iVar2);
              if (iVar4 < 1) {
                __assert_fail("Range > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                              ,0x209,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
              }
              if (iVar1 == 1) {
                iVar1 = Bac_BoxBi(p,i,StartPos);
                Bac_ManWriteConcat(p,iVar1,iVar4);
                StartPos = iVar4 + StartPos;
              }
              else {
                if (iVar1 != 2) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                                ,0x20e,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
                }
                iVar1 = Bac_BoxBo(p,i,Value);
                Bac_ManWriteConcat(p,iVar1,iVar4);
                Value = iVar4 + Value;
              }
              Vec_StrPrintStr(p_00,")");
            }
            iVar1 = Bac_BoxBiNum(p,i);
            if (StartPos != iVar1) {
              __assert_fail("i == Bac_BoxBiNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x211,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
            iVar1 = Bac_BoxBoNum(p,i);
            if (Value != iVar1) {
              __assert_fail("o == Bac_BoxBoNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacWriteVer.c"
                            ,0x212,"void Bac_ManWriteVerilogBoxes(Bac_Ntk_t *, int)");
            }
          }
          Vec_StrPrintStr(p_00,");\n");
        }
      }
      else {
        Bac_ManWriteGate(p,i);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Bac_ManWriteVerilogBoxes( Bac_Ntk_t * p, int fUseAssign )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    int iObj, k, i, o, StartPos;
    Bac_NtkForEachBox( p, iObj ) // .subckt/.gate/box (formal/actual binding) 
    {
        // skip constants
        if ( Bac_ObjIsConst(p, iObj) )
            continue;
        // write mapped
        if ( Bac_ObjIsGate(p, iObj) )
        {
            Bac_ManWriteGate( p, iObj );
            continue;
        }
        // write primitives as assign-statements
        if ( !Bac_ObjIsBoxUser(p, iObj) && fUseAssign )
        {
            Bac_ManWriteAssign( p, iObj );
            continue;
        }
        // write header
        StartPos = Vec_StrSize(vStr);
        if ( Bac_ObjIsBoxUser(p, iObj) )
        {
            int Value, Beg, End, Range;
            Bac_Ntk_t * pModel = Bac_BoxNtk( p, iObj );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, Bac_NtkName(pModel) );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write arguments
            i = o = 0;
            assert( Bac_NtkInfoNum(pModel) );
            Vec_IntForEachEntryTriple( &pModel->vInfo, Value, Beg, End, k )
            {
                int NameId = Abc_Lit2Var2( Value );
                int Type = Abc_Lit2Att2( Value );
                Vec_StrPrintStr( vStr, k ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPrintStr( vStr, Bac_NtkStr(p, NameId) );
                Vec_StrPrintStr( vStr, "(" );
                Range = Bac_InfoRange( Beg, End );
                assert( Range > 0 );
                if ( Type == 1 )
                    Bac_ManWriteConcat( p, Bac_BoxBi(p, iObj, i), Range ), i += Range;
                else if ( Type == 2 )
                    Bac_ManWriteConcat( p, Bac_BoxBo(p, iObj, o), Range ), o += Range;
                else assert( 0 );
                Vec_StrPrintStr( vStr, ")" );
            }
            assert( i == Bac_BoxBiNum(p, iObj) );
            assert( o == Bac_BoxBoNum(p, iObj) );
        }
        else
        {
            int iTerm, k, Range, iSig = 0;
            Vec_Int_t * vBits = Bac_BoxCollectRanges( p, iObj );
            char * pName = Bac_NtkGenerateName( p, Bac_ObjType(p, iObj), vBits );
            char * pSymbs = Bac_ManPrimSymb( p->pDesign, Bac_ObjType(p, iObj) );
            Vec_StrPrintStr( vStr, "  " );
            Vec_StrPrintStr( vStr, pName );
            Vec_StrPrintStr( vStr, " " );
            Vec_StrPrintStr( vStr, Bac_ObjName(p, iObj) ? Bac_ObjNameStr(p, iObj) : ""  );
            Vec_StrPrintStr( vStr, " (" );
            // write inputs
            Bac_BoxForEachBiMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            Bac_BoxForEachBoMain( p, iObj, iTerm, k )
            {
                Range = Vec_IntEntry( vBits, iSig );
                Vec_StrPrintStr( vStr, iSig ? ", " : "" );
                if ( Vec_StrSize(vStr) > StartPos + 70 )
                {
                    StartPos = Vec_StrSize(vStr);
                    Vec_StrPrintStr( vStr, "\n    " );
                }
                Vec_StrPrintStr( vStr, "." );
                Vec_StrPush( vStr, pSymbs[iSig] );
                Vec_StrPrintStr( vStr, "(" );
                Bac_ManWriteConcat( p, iTerm, Range );
                Vec_StrPrintStr( vStr, ")" );
                iSig++;
            }
            assert( iSig == Vec_IntSize(vBits) );
        }
        Vec_StrPrintStr( vStr, ");\n" );
    }
}